

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

ostream * despot::operator<<(ostream *os,vector<despot::State,_std::allocator<despot::State>_> *vec)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  if ((vec->super__Vector_base<despot::State,_std::allocator<despot::State>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (vec->super__Vector_base<despot::State,_std::allocator<despot::State>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      pcVar2 = ", ";
      if (lVar3 == 0) {
        pcVar2 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,(ulong)((uint)(lVar3 != 0) * 2));
      operator<<(os,(State *)((long)&((vec->
                                      super__Vector_base<despot::State,_std::allocator<despot::State>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->_vptr_State +
                             lVar3));
      uVar1 = uVar1 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar1 < (ulong)((long)(vec->
                                   super__Vector_base<despot::State,_std::allocator<despot::State>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(vec->
                                   super__Vector_base<despot::State,_std::allocator<despot::State>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}